

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O0

bool __thiscall SQVM::CMP_OP(SQVM *this,CmpOP op,SQObjectPtr *o1,SQObjectPtr *o2,SQObjectPtr *res)

{
  bool bVar1;
  long local_40;
  SQInteger r;
  SQObjectPtr *res_local;
  SQObjectPtr *o2_local;
  SQObjectPtr *o1_local;
  SQVM *pSStack_18;
  CmpOP op_local;
  SQVM *this_local;
  
  r = (SQInteger)res;
  res_local = o2;
  o2_local = o1;
  o1_local._4_4_ = op;
  pSStack_18 = this;
  bVar1 = ObjCmp(this,o1,o2,&local_40);
  if (bVar1) {
    switch(o1_local._4_4_) {
    case CMP_G:
      ::SQObjectPtr::operator=((SQObjectPtr *)r,0 < local_40);
      this_local._7_1_ = true;
      break;
    default:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/breakin[P]snestistics/deps/squirrel/squirrel/sqvm.cpp"
                    ,0x117,
                    "bool SQVM::CMP_OP(CmpOP, const SQObjectPtr &, const SQObjectPtr &, SQObjectPtr &)"
                   );
    case CMP_GE:
      ::SQObjectPtr::operator=((SQObjectPtr *)r,-1 < local_40);
      this_local._7_1_ = true;
      break;
    case CMP_L:
      ::SQObjectPtr::operator=((SQObjectPtr *)r,local_40 < 0);
      this_local._7_1_ = true;
      break;
    case CMP_LE:
      ::SQObjectPtr::operator=((SQObjectPtr *)r,local_40 < 1);
      this_local._7_1_ = true;
      break;
    case CMP_3W:
      ::SQObjectPtr::operator=((SQObjectPtr *)r,local_40);
      this_local._7_1_ = true;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool SQVM::CMP_OP(CmpOP op, const SQObjectPtr &o1,const SQObjectPtr &o2,SQObjectPtr &res)
{
    SQInteger r;
    if(ObjCmp(o1,o2,r)) {
        switch(op) {
            case CMP_G: res = (r > 0); return true;
            case CMP_GE: res = (r >= 0); return true;
            case CMP_L: res = (r < 0); return true;
            case CMP_LE: res = (r <= 0); return true;
            case CMP_3W: res = r; return true;
        }
        assert(0);
    }
    return false;
}